

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# EnvmapImage.cpp
# Opt level: O1

Rgba __thiscall EnvmapImage::filteredLookup(EnvmapImage *this,V3f *d,float r,int n)

{
  undefined4 uVar1;
  undefined4 uVar2;
  undefined4 uVar3;
  undefined4 uVar4;
  undefined4 uVar5;
  undefined4 uVar6;
  undefined4 uVar7;
  undefined4 uVar8;
  char cVar9;
  uint uVar10;
  Rgba RVar11;
  uint uVar12;
  ulong uVar13;
  int iVar14;
  uint uVar15;
  uint uVar16;
  uint uVar17;
  float fVar18;
  undefined4 uVar19;
  undefined4 extraout_XMM0_Db;
  undefined4 extraout_XMM0_Db_00;
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  float fVar24;
  float fVar26;
  undefined1 auVar25 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  Vec3<float> local_f8;
  float local_e8;
  float local_e4;
  float local_e0;
  float local_dc;
  undefined1 local_d8 [8];
  float fStack_d0;
  float fStack_cc;
  float local_c8;
  float fStack_c4;
  float fStack_c0;
  float fStack_bc;
  float local_b8;
  float fStack_b4;
  float fStack_b0;
  float fStack_ac;
  ulong local_a0;
  ulong local_98;
  EnvmapImage *local_90;
  V3f *local_88;
  code *local_80;
  float local_78;
  float fStack_74;
  float fStack_70;
  float fStack_6c;
  undefined1 local_68 [16];
  float local_58;
  float fStack_54;
  float fStack_50;
  float fStack_4c;
  undefined1 local_48 [16];
  V2f local_38;
  
  local_80 = anon_unknown.dwarf_818c::dirToPosCube;
  if (this->_type == ENVMAP_LATLONG) {
    local_80 = anon_unknown.dwarf_818c::dirToPosLatLong;
  }
  uVar19 = 0;
  fVar18 = d->z * d->z + d->x * d->x + d->y * d->y;
  local_c8 = r;
  if (fVar18 < 2.3509887e-38) {
    fVar18 = Imath_3_2::Vec3<float>::lengthTiny(d);
    uVar19 = extraout_XMM0_Db_00;
  }
  else if (fVar18 < 0.0) {
    fVar18 = sqrtf(fVar18);
    uVar19 = extraout_XMM0_Db;
  }
  else {
    fVar18 = SQRT(fVar18);
  }
  if ((fVar18 != 0.0) || (NAN(fVar18))) {
    uVar1 = d->x;
    uVar5 = d->y;
    auVar20._4_4_ = uVar5;
    auVar20._0_4_ = uVar1;
    auVar20._8_8_ = 0;
    auVar21._4_4_ = fVar18;
    auVar21._0_4_ = fVar18;
    auVar21._8_4_ = uVar19;
    auVar21._12_4_ = uVar19;
    auVar21 = divps(auVar20,auVar21);
    d->x = (float)(int)auVar21._0_8_;
    d->y = (float)(int)((ulong)auVar21._0_8_ >> 0x20);
    d->z = d->z / fVar18;
  }
  local_f8.z = d->x;
  if (ABS(local_f8.z) <= 0.707) {
    local_f8.y = d->z - local_f8.z * 0.0;
    local_f8.z = local_f8.z * 0.0 - d->y;
    local_f8.x = d->y * 0.0 + d->z * -0.0;
    fVar18 = local_f8.z * local_f8.z + local_f8.x * local_f8.x + local_f8.y * local_f8.y;
    if (fVar18 < 2.3509887e-38) goto LAB_00103cf5;
    if (0.0 <= fVar18) {
      fVar18 = SQRT(fVar18);
      goto LAB_00103728;
    }
  }
  else {
    uVar2 = d->y;
    uVar6 = d->z;
    fVar18 = (float)uVar2 * 0.0 + -(float)uVar6;
    fVar26 = (float)uVar6 * 0.0 + local_f8.z * -0.0;
    local_f8._0_8_ = CONCAT44(fVar26,fVar18);
    local_f8.z = (float)uVar2 * -0.0 + local_f8.z;
    fVar18 = local_f8.z * local_f8.z + fVar18 * fVar18 + fVar26 * fVar26;
    if (fVar18 < 2.3509887e-38) {
LAB_00103cf5:
      fVar18 = Imath_3_2::Vec3<float>::lengthTiny(&local_f8);
      goto LAB_00103728;
    }
    if (0.0 <= fVar18) {
      fVar18 = SQRT(fVar18);
      goto LAB_00103728;
    }
  }
  fVar18 = sqrtf(fVar18);
LAB_00103728:
  fVar26 = 0.0;
  if ((fVar18 != 0.0) || (NAN(fVar18))) {
    auVar27._8_8_ = 0;
    auVar27._0_4_ = local_f8.x;
    auVar27._4_4_ = local_f8.y;
    auVar22._4_4_ = fVar18;
    auVar22._0_4_ = fVar18;
    auVar22._8_4_ = fVar18;
    auVar22._12_4_ = fVar18;
    auVar21 = divps(auVar27,auVar22);
    fVar26 = local_f8.z / fVar18;
  }
  else {
    auVar21 = ZEXT816(0);
  }
  fVar26 = fVar26 * local_c8;
  local_68 = ZEXT416((uint)fVar26);
  local_b8 = local_c8;
  fStack_b4 = local_c8;
  fStack_b0 = local_c8;
  fStack_ac = local_c8;
  local_78 = auVar21._0_4_ * local_c8;
  fStack_74 = auVar21._4_4_ * local_c8;
  fStack_70 = auVar21._8_4_ * local_c8;
  fStack_6c = auVar21._12_4_ * local_c8;
  uVar3 = d->y;
  uVar7 = d->z;
  fVar18 = fVar26 * (float)uVar3 - fStack_74 * (float)uVar7;
  fVar26 = local_78 * (float)uVar7 - fVar26 * d->x;
  local_f8._0_8_ = CONCAT44(fVar26,fVar18);
  local_f8.z = fStack_74 * d->x - (float)uVar3 * local_78;
  fVar18 = local_f8.z * local_f8.z + fVar18 * fVar18 + fVar26 * fVar26;
  local_88 = d;
  if (fVar18 < 2.3509887e-38) {
    fVar18 = Imath_3_2::Vec3<float>::lengthTiny(&local_f8);
  }
  else if (fVar18 < 0.0) {
    fVar18 = sqrtf(fVar18);
  }
  else {
    fVar18 = SQRT(fVar18);
  }
  fVar24 = 0.0;
  fStack_c4 = 0.0;
  fStack_c0 = 0.0;
  fStack_bc = 0.0;
  fVar26 = 0.0;
  local_e8 = 0.0;
  _local_d8 = ZEXT812(0);
  fStack_cc = 0.0;
  if ((fVar18 != 0.0) || (NAN(fVar18))) {
    auVar25._8_8_ = 0;
    auVar25._0_4_ = local_f8.x;
    auVar25._4_4_ = local_f8.y;
    auVar23._4_4_ = fVar18;
    auVar23._0_4_ = fVar18;
    auVar23._8_4_ = fVar18;
    auVar23._12_4_ = fVar18;
    _local_d8 = divps(auVar25,auVar23);
    local_e8 = local_f8.z / fVar18;
  }
  if (0 < n) {
    local_d8._4_4_ = (float)local_d8._4_4_ * fStack_b4;
    local_d8._0_4_ = (float)local_d8._0_4_ * local_b8;
    fStack_d0 = fStack_d0 * fStack_b0;
    fStack_cc = fStack_cc * fStack_ac;
    local_e8 = local_e8 * local_c8;
    local_e4 = (float)(n + 1);
    uVar10 = 0;
    auVar28._0_12_ = ZEXT812(0x3f800000);
    auVar28._12_4_ = 0;
    local_a0 = (ulong)(uint)n;
    local_90 = this;
    do {
      local_98 = (ulong)uVar10;
      fStack_4c = (float)(int)(uVar10 * 2 + 2) / local_e4 + -1.0;
      local_dc = auVar28._0_4_ - ABS(fStack_4c);
      local_e0 = local_e8 * fStack_4c;
      local_58 = fStack_4c * (float)local_d8._0_4_;
      fStack_54 = fStack_4c * (float)local_d8._4_4_;
      fStack_50 = fStack_4c * fStack_d0;
      fStack_4c = fStack_4c * fStack_cc;
      iVar14 = 2;
      uVar13 = local_a0;
      do {
        fVar18 = (float)iVar14 / local_e4 + -1.0;
        local_48._4_12_ = auVar28._4_12_;
        local_48._0_4_ = auVar28._0_4_ - ABS(fVar18);
        local_f8.z = local_68._0_4_ * fVar18 + local_88->z + local_e0;
        uVar4 = local_88->x;
        uVar8 = local_88->y;
        local_f8.y = (float)uVar8 + fVar18 * fStack_74 + fStack_54;
        local_f8.x = (float)uVar4 + fVar18 * local_78 + local_58;
        local_c8 = fVar24;
        local_b8 = fVar26;
        (*local_80)(&local_38,&this->_dataWindow,&local_f8);
        RVar11 = sample(local_90,&local_38);
        auVar28._0_12_ = ZEXT812(0x3f800000);
        auVar28._12_4_ = 0;
        local_48._0_4_ = (float)local_48._0_4_ * local_dc;
        fVar26 = local_b8 + (float)local_48._0_4_;
        fVar24 = local_c8 +
                 (float)local_48._0_4_ *
                 *(float *)(_imath_half_to_float_table + ((ulong)RVar11 >> 0x30) * 4);
        fStack_c4 = fStack_c4 +
                    (float)local_48._0_4_ *
                    *(float *)(_imath_half_to_float_table + (ulong)(RVar11._4_4_ & 0xffff) * 4);
        fStack_c0 = fStack_c0 +
                    (float)local_48._0_4_ *
                    *(float *)(_imath_half_to_float_table + (ulong)(RVar11._0_4_ >> 0x10) * 4);
        fStack_bc = fStack_bc +
                    (float)local_48._0_4_ *
                    *(float *)(_imath_half_to_float_table + (ulong)(RVar11._0_4_ & 0xffff) * 4);
        iVar14 = iVar14 + 2;
        uVar10 = (int)uVar13 - 1;
        uVar13 = (ulong)uVar10;
      } while (uVar10 != 0);
      uVar10 = (int)local_98 + 1;
    } while (uVar10 != (uint)local_a0);
  }
  fVar26 = 1.0 / fVar26;
  fVar18 = ABS(fStack_bc * fVar26);
  uVar10 = (uint)(fStack_bc * fVar26) >> 0x10 & 0x8000;
  if ((uint)fVar18 < 0x38800000) {
    if ((0x33000000 < (uint)fVar18) &&
       (uVar12 = (uint)fVar18 & 0x7fffff | 0x800000, cVar9 = (char)((uint)fVar18 >> 0x17),
       uVar10 = uVar10 | uVar12 >> (0x7eU - cVar9 & 0x1f),
       0x80000000 < uVar12 << (cVar9 + 0xa2U & 0x1f))) {
      uVar10 = uVar10 + 1;
    }
  }
  else if ((uint)fVar18 < 0x7f800000) {
    if ((uint)fVar18 < 0x477ff000) {
      uVar10 = (int)fVar18 + 0x8000fff + (uint)(((uint)fVar18 >> 0xd & 1) != 0) >> 0xd | uVar10;
    }
    else {
      uVar10 = uVar10 | 0x7c00;
    }
  }
  else {
    uVar10 = uVar10 | 0x7c00;
    if (fVar18 != INFINITY) {
      uVar12 = (uint)fVar18 >> 0xd & 0x3ff;
      uVar10 = uVar10 | uVar12 | (uint)(uVar12 == 0);
    }
  }
  fVar18 = ABS(fStack_c0 * fVar26);
  uVar12 = (uint)(fStack_c0 * fVar26) >> 0x10 & 0x8000;
  if ((uint)fVar18 < 0x38800000) {
    if ((0x33000000 < (uint)fVar18) &&
       (uVar15 = (uint)fVar18 & 0x7fffff | 0x800000, cVar9 = (char)((uint)fVar18 >> 0x17),
       uVar12 = uVar12 | uVar15 >> (0x7eU - cVar9 & 0x1f),
       0x80000000 < uVar15 << (cVar9 + 0xa2U & 0x1f))) {
      uVar12 = uVar12 + 1;
    }
  }
  else if ((uint)fVar18 < 0x7f800000) {
    if ((uint)fVar18 < 0x477ff000) {
      uVar12 = (int)fVar18 + 0x8000fff + (uint)(((uint)fVar18 >> 0xd & 1) != 0) >> 0xd | uVar12;
    }
    else {
      uVar12 = uVar12 | 0x7c00;
    }
  }
  else {
    uVar12 = uVar12 | 0x7c00;
    if (fVar18 != INFINITY) {
      uVar15 = (uint)fVar18 >> 0xd & 0x3ff;
      uVar12 = uVar12 | uVar15 | (uint)(uVar15 == 0);
    }
  }
  fVar18 = ABS(fStack_c4 * fVar26);
  uVar15 = (uint)(fStack_c4 * fVar26) >> 0x10 & 0x8000;
  if ((uint)fVar18 < 0x38800000) {
    if ((0x33000000 < (uint)fVar18) &&
       (uVar16 = (uint)fVar18 & 0x7fffff | 0x800000, cVar9 = (char)((uint)fVar18 >> 0x17),
       uVar15 = uVar15 | uVar16 >> (0x7eU - cVar9 & 0x1f),
       0x80000000 < uVar16 << (cVar9 + 0xa2U & 0x1f))) {
      uVar15 = uVar15 + 1;
    }
  }
  else if ((uint)fVar18 < 0x7f800000) {
    if ((uint)fVar18 < 0x477ff000) {
      uVar15 = (int)fVar18 + 0x8000fff + (uint)(((uint)fVar18 >> 0xd & 1) != 0) >> 0xd | uVar15;
    }
    else {
      uVar15 = uVar15 | 0x7c00;
    }
  }
  else {
    uVar15 = uVar15 | 0x7c00;
    if (fVar18 != INFINITY) {
      uVar16 = (uint)fVar18 >> 0xd & 0x3ff;
      uVar15 = uVar15 | uVar16 | (uint)(uVar16 == 0);
    }
  }
  fVar18 = ABS(fVar24 * fVar26);
  uVar16 = (uint)(fVar24 * fVar26) >> 0x10 & 0x8000;
  if ((uint)fVar18 < 0x38800000) {
    if ((0x33000000 < (uint)fVar18) &&
       (uVar17 = (uint)fVar18 & 0x7fffff | 0x800000, cVar9 = (char)((uint)fVar18 >> 0x17),
       uVar16 = uVar16 | uVar17 >> (0x7eU - cVar9 & 0x1f),
       0x80000000 < uVar17 << (cVar9 + 0xa2U & 0x1f))) {
      uVar16 = uVar16 + 1;
    }
  }
  else if ((uint)fVar18 < 0x7f800000) {
    if ((uint)fVar18 < 0x477ff000) {
      uVar16 = (int)fVar18 + 0x8000fff + (uint)(((uint)fVar18 >> 0xd & 1) != 0) >> 0xd | uVar16;
    }
    else {
      uVar16 = uVar16 | 0x7c00;
    }
  }
  else {
    uVar16 = uVar16 | 0x7c00;
    if (fVar18 != INFINITY) {
      uVar17 = (uint)fVar18 >> 0xd & 0x3ff;
      uVar16 = uVar16 | uVar17 | (uint)(uVar17 == 0);
    }
  }
  return (Rgba)((ulong)(uVar10 & 0xffff) |
               (ulong)(uVar12 << 0x10) |
               (ulong)(uVar15 & 0xffff) << 0x20 | (ulong)(uVar16 & 0xffff) << 0x30);
}

Assistant:

Rgba
EnvmapImage::filteredLookup (V3f d, float r, int n) const
{
    //
    // Filtered environment map lookup: Take n by n point samples
    // from the environment map, clustered around direction d, and
    // combine the samples with a tent filter.
    //

    //
    // Depending on the type of map, pick an appropriate function
    // to convert 3D directions to 2D pixel poitions.
    //

    V2f (*dirToPos) (const Box2i&, const V3f&);

    if (_type == ENVMAP_LATLONG)
        dirToPos = dirToPosLatLong;
    else
        dirToPos = dirToPosCube;

    //
    // Pick two vectors, dx and dy, of length r, that are orthogonal
    // to the lookup direction, d, and to each other.
    //

    d.normalize ();
    V3f dx, dy;

    if (abs (d.x) > 0.707f)
        dx = (d % V3f (0, 1, 0)).normalized () * r;
    else
        dx = (d % V3f (1, 0, 0)).normalized () * r;

    dy = (d % dx).normalized () * r;

    //
    // Take n by n point samples from the map, and add them up.
    // The directions for the point samples are all within the pyramid
    // defined by the vectors d-dy-dx, d-dy+dx, d+dy-dx, d+dy+dx.
    //

    float wt = 0;

    float cr = 0;
    float cg = 0;
    float cb = 0;
    float ca = 0;

    for (int y = 0; y < n; ++y)
    {
        float ry = float (2 * y + 2) / float (n + 1) - 1;
        float wy = 1 - abs (ry);
        V3f   ddy (ry * dy);

        for (int x = 0; x < n; ++x)
        {
            float rx = float (2 * x + 2) / float (n + 1) - 1;
            float wx = 1 - abs (rx);
            V3f   ddx (rx * dx);

            Rgba s = sample (dirToPos (_dataWindow, d + ddx + ddy));

            float w = wx * wy;
            wt += w;

            cr += s.r * w;
            cg += s.g * w;
            cb += s.b * w;
            ca += s.a * w;
        }
    }

    wt = 1 / wt;

    Rgba c;

    c.r = cr * wt;
    c.g = cg * wt;
    c.b = cb * wt;
    c.a = ca * wt;

    return c;
}